

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * MyGame_Example_notemptyenum_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  flatcc_json_parser_t *pfVar2;
  uint64_t w;
  char *mark;
  char *unmatched;
  int *aggregate_local;
  uint64_t *value_local;
  int *value_sign_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  ctx_local = (flatcc_json_parser_t *)buf;
  if (((uVar1 & 0xff00000000000000) == 0x7800000000000000) &&
     (pfVar2 = (flatcc_json_parser_t *)flatcc_json_parser_match_constant(ctx,buf,end,1,aggregate),
     pfVar2 != (flatcc_json_parser_t *)buf)) {
    *value = 0;
    *value_sign = 0;
    ctx_local = pfVar2;
  }
  return (char *)ctx_local;
}

Assistant:

static const char *MyGame_Example_notemptyenum_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if ((w & 0xff00000000000000) == 0x7800000000000000) { /* "x" */
        buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 1, aggregate);
        if (buf != mark) {
            *value = UINT64_C(0), *value_sign = 0;
        } else {
            return unmatched;
        }
    } else { /* "x" */
        return unmatched;
    } /* "x" */
    return buf;
}